

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cc
# Opt level: O1

ssize_t __thiscall testbench::memory::read(memory *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong unaff_RBP;
  pointer psVar6;
  
  psVar1 = (this->ranges).
           super__Vector_base<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->ranges).
                super__Vector_base<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1) {
    peVar2 = (psVar6->super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    this_00 = (psVar6->super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    iVar4 = (*peVar2->_vptr_address_range[1])(peVar2);
    bVar3 = true;
    if (((char)iVar4 != '\0') &&
       (iVar4 = (*peVar2->_vptr_address_range[2])(peVar2,(ulong)(uint)__fd), (char)iVar4 != '\0')) {
      uVar5 = (*peVar2->_vptr_address_range[3])(peVar2,(ulong)(uint)__fd);
      unaff_RBP = (ulong)uVar5;
      bVar3 = false;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (!bVar3) goto LAB_001062b5;
  }
  unaff_RBP = 0;
LAB_001062b5:
  return unaff_RBP & 0xffffffff;
}

Assistant:

unsigned char memory::read(unsigned address) const noexcept
{
    for (auto range : ranges) {
        if (range->is_visible() and range->contains(address)) {
            return range->read(address);
        }
    }
    return 0;
}